

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DoIt(void)

{
  undefined1 local_3080 [8];
  ValidateFootprint vFP;
  
  ValidateFootprint::ValidateFootprint((ValidateFootprint *)local_3080);
  Validate::SkipHeaderRow((Validate *)&vFP);
  ValidateFootprint::ReadFootprintFile((ValidateFootprint *)local_3080);
  ValidateFootprint::PrintMaximumIntensityBinIndex((ValidateFootprint *)local_3080);
  Validate::PrintSuccessMessage((Validate *)&vFP);
  ValidateFootprint::~ValidateFootprint((ValidateFootprint *)local_3080);
  return;
}

Assistant:

void DoIt() {

  ValidateFootprint vFP;
  vFP.SkipHeaderRow();
  vFP.ReadFootprintFile();
  vFP.PrintMaximumIntensityBinIndex();
  vFP.PrintSuccessMessage();

}